

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::test(FastText *this,istream *in,int32_t k)

{
  bool bVar1;
  int iVar2;
  _Setprecision _Var3;
  size_type sVar4;
  ostream *poVar5;
  void *pvVar6;
  ostream *this_00;
  int in_EDX;
  const_iterator it;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> modelPredictions;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  double precision;
  int32_t nlabels;
  int32_t nexamples;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea8;
  __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  *in_stack_fffffffffffffeb0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffec0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Dictionary *in_stack_ffffffffffffff00;
  __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_88 [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  istream *in_stack_ffffffffffffffc8;
  Dictionary *in_stack_ffffffffffffffd0;
  pointer local_28;
  int local_1c;
  int local_18;
  
  local_18 = 0;
  local_1c = 0;
  local_28 = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13957e);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13958b);
  while (iVar2 = std::istream::peek(), iVar2 != -1) {
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1395c2);
    std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1395e8);
    Dictionary::getLine(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                        in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        (minstd_rand *)in_stack_ffffffffffffffb0._M_pi);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x139627);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x139639);
    Dictionary::addNgrams
              (in_stack_ffffffffffffff00,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (int32_t)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8);
    if ((sVar4 != 0) &&
       (sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc0),
       sVar4 != 0)) {
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)0x139693)
      ;
      std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1396a4);
      Model::predict((Model *)in_stack_fffffffffffffec0._M_current,in_stack_fffffffffffffeb8,
                     (int32_t)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                     (vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                     in_stack_fffffffffffffea8);
      local_88[0]._M_current =
           (pair<float,_int> *)
           std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::cbegin
                     ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                      in_stack_fffffffffffffea8);
      while( true ) {
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::cend
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   in_stack_fffffffffffffea8);
        bVar1 = __gnu_cxx::operator!=
                          (in_stack_fffffffffffffeb0,
                           (__normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                            *)in_stack_fffffffffffffea8);
        if (!bVar1) break;
        in_stack_ffffffffffffff00 = (Dictionary *)&stack0xffffffffffffffa8;
        std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffea8);
        std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffea8);
        __gnu_cxx::
        __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
        ::operator->(local_88);
        std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                  (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   (int *)in_stack_fffffffffffffeb8);
        std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffea8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffffeb0,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffffea8);
        if (bVar1) {
          local_28 = (pointer)((double)local_28 + 1.0);
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
        ::operator++((__normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                      *)in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      }
      local_18 = local_18 + 1;
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8);
      local_1c = local_1c + (int)sVar4;
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~vector
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 in_stack_fffffffffffffec0._M_current);
    }
  }
  _Var3 = std::setprecision(3);
  std::operator<<((ostream *)&std::cout,_Var3);
  poVar5 = std::operator<<((ostream *)&std::cout,"P@");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_EDX);
  poVar5 = std::operator<<(poVar5,": ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,(double)local_28 / (double)(in_EDX * local_18));
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"R@");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_EDX);
  poVar5 = std::operator<<(poVar5,": ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,(double)local_28 / (double)local_1c);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  this_00 = std::operator<<((ostream *)&std::cout,"Number of examples: ");
  pvVar6 = (void *)std::ostream::operator<<(this_00,local_18);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)poVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)poVar5);
  return;
}

Assistant:

void FastText::test(std::istream& in, int32_t k) {
  int32_t nexamples = 0, nlabels = 0;
  double precision = 0.0;
  std::vector<int32_t> line, labels;

  while (in.peek() != EOF) {
    dict_->getLine(in, line, labels, model_->rng);
    dict_->addNgrams(line, args_->wordNgrams);
    if (labels.size() > 0 && line.size() > 0) {
      std::vector<std::pair<real, int32_t>> modelPredictions;
      model_->predict(line, k, modelPredictions);
      for (auto it = modelPredictions.cbegin(); it != modelPredictions.cend(); it++) {
        if (std::find(labels.begin(), labels.end(), it->second) != labels.end()) {
          precision += 1.0;
        }
      }
      nexamples++;
      nlabels += labels.size();
    }
  }
  std::cout << std::setprecision(3);
  std::cout << "P@" << k << ": " << precision / (k * nexamples) << std::endl;
  std::cout << "R@" << k << ": " << precision / nlabels << std::endl;
  std::cout << "Number of examples: " << nexamples << std::endl;
}